

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

void ZSTD_setBasePrices(optState_t *optPtr,int optLevel)

{
  int iVar1;
  uint uVar2;
  U32 UVar3;
  U32 UVar4;
  U32 UVar5;
  
  if (optPtr->literalCompressionMode != ZSTD_lcm_uncompressed) {
    uVar2 = optPtr->litSum + 1;
    iVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    if (optLevel == 0) {
      UVar3 = iVar1 << 8;
    }
    else {
      UVar3 = (uVar2 * 0x100 >> ((byte)iVar1 & 0x1f)) + iVar1 * 0x100;
    }
    optPtr->litSumBasePrice = UVar3;
  }
  uVar2 = optPtr->litLengthSum + 1;
  iVar1 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  if (optLevel == 0) {
    UVar3 = iVar1 << 8;
    uVar2 = optPtr->matchLengthSum + 1;
    iVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    UVar4 = iVar1 << 8;
    uVar2 = optPtr->offCodeSum + 1;
    iVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    UVar5 = iVar1 << 8;
  }
  else {
    UVar3 = (uVar2 * 0x100 >> ((byte)iVar1 & 0x1f)) + iVar1 * 0x100;
    uVar2 = optPtr->matchLengthSum + 1;
    iVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    UVar4 = (uVar2 * 0x100 >> ((byte)iVar1 & 0x1f)) + iVar1 * 0x100;
    uVar2 = optPtr->offCodeSum + 1;
    iVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    UVar5 = (uVar2 * 0x100 >> ((byte)iVar1 & 0x1f)) + iVar1 * 0x100;
  }
  optPtr->litLengthSumBasePrice = UVar3;
  optPtr->matchLengthSumBasePrice = UVar4;
  optPtr->offCodeSumBasePrice = UVar5;
  return;
}

Assistant:

static void ZSTD_setBasePrices(optState_t* optPtr, int optLevel)
{
    if (ZSTD_compressedLiterals(optPtr))
        optPtr->litSumBasePrice = WEIGHT(optPtr->litSum, optLevel);
    optPtr->litLengthSumBasePrice = WEIGHT(optPtr->litLengthSum, optLevel);
    optPtr->matchLengthSumBasePrice = WEIGHT(optPtr->matchLengthSum, optLevel);
    optPtr->offCodeSumBasePrice = WEIGHT(optPtr->offCodeSum, optLevel);
}